

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_clearModelImportsBeforeResolving_Test::Importer_clearModelImportsBeforeResolving_Test
          (Importer_clearModelImportsBeforeResolving_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00168880;
  return;
}

Assistant:

TEST(Importer, clearModelImportsBeforeResolving)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/ImportCircularReferences.cellml"));
    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));

    // Circular import issue generated.
    EXPECT_EQ(size_t(1), importer->issueCount());

    // Change URL away from circular import to the correct file.
    model->component("controller")->importSource()->setUrl("NotCircularReference.cellml");

    // Resolve imports again after clearing the issues.
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(0), importer->issueCount());
}